

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::list_writer
          (string *__return_storage_ptr__,t_st_generator *this,t_list *tlist,string *fname)

{
  int *piVar1;
  t_type *t;
  ostream *poVar2;
  char *this_00;
  string val;
  ostringstream out;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  temp_name_abi_cxx11_(&local_200,this);
  this_00 = "[oprot writeListBegin: (TList new elemType: ";
  poVar2 = std::operator<<(&local_1a0,"[oprot writeListBegin: (TList new elemType: ");
  type_to_enum_abi_cxx11_(&local_220,(t_st_generator *)this_00,tlist->elem_type_);
  poVar2 = std::operator<<(poVar2,(string *)&local_220);
  poVar2 = std::operator<<(poVar2,"; size: ");
  poVar2 = std::operator<<(poVar2,(string *)fname);
  poVar2 = std::operator<<(poVar2," size).");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_220);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
  poVar2 = std::operator<<(&local_1a0,(string *)&local_220);
  poVar2 = std::operator<<(poVar2,(string *)fname);
  poVar2 = std::operator<<(poVar2," do: [:");
  poVar2 = std::operator<<(poVar2,(string *)&local_200);
  poVar2 = std::operator<<(poVar2,"|");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_220);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
  poVar2 = std::operator<<(&local_1a0,(string *)&local_220);
  t = tlist->elem_type_;
  std::__cxx11::string::string((string *)&local_1e0,(string *)&local_200);
  write_val(&local_1c0,this,t,&local_1e0);
  poVar2 = std::operator<<(poVar2,(string *)&local_1c0);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_220);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = std::operator<<(&local_1a0,"].");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_220);
  std::operator<<(poVar2,"oprot writeListEnd] value");
  std::__cxx11::string::~string((string *)&local_220);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::list_writer(t_list* tlist, string fname) {
  std::ostringstream out;
  string val = temp_name();

  out << "[oprot writeListBegin: (TList new elemType: " << type_to_enum(tlist->get_elem_type())
      << "; size: " << fname << " size)." << endl;
  indent_up();

  out << indent() << fname << " do: [:" << val << "|" << endl;
  indent_up();

  out << indent() << write_val(tlist->get_elem_type(), val) << endl;
  indent_down();

  out << "]." << endl << indent() << "oprot writeListEnd] value";
  indent_down();

  return out.str();
}